

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

void copy2buff(StkId top,int n,char *buff)

{
  long lVar1;
  long lVar2;
  long lVar3;
  StkId pSVar4;
  size_t __n;
  
  lVar2 = (long)n + 1;
  pSVar4 = top + -(long)n;
  lVar3 = 0;
  do {
    lVar1 = *(long *)pSVar4;
    __n = (size_t)*(byte *)(lVar1 + 0xb);
    if (__n == 0xff) {
      __n = *(size_t *)(lVar1 + 0x10);
    }
    memcpy(buff + lVar3,(void *)(lVar1 + 0x18),__n);
    lVar3 = lVar3 + __n;
    lVar2 = lVar2 + -1;
    pSVar4 = pSVar4 + 1;
  } while (1 < lVar2);
  return;
}

Assistant:

static void copy2buff (StkId top, int n, char *buff) {
  size_t tl = 0;  /* size already copied */
  do {
    TString *st = tsvalue(s2v(top - n));
    size_t l = tsslen(st);  /* length of string being copied */
    memcpy(buff + tl, getstr(st), l * sizeof(char));
    tl += l;
  } while (--n > 0);
}